

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O0

void __thiscall
duckdb::ART::VerifyAppend
          (ART *this,DataChunk *chunk,IndexAppendInfo *info,
          optional_ptr<duckdb::ConflictManager,_true> manager)

{
  bool bVar1;
  ConflictManager *pCVar2;
  ConflictManager *this_00;
  undefined8 in_RDX;
  DataChunk *in_RSI;
  long *in_RDI;
  ConflictManager local_manager;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 uVar3;
  optional_ptr<duckdb::ConflictManager,_true> *in_stack_fffffffffffffe90;
  optional_ptr<duckdb::ConflictInfo,_true> in_stack_fffffffffffffea0;
  optional_ptr<duckdb::ConflictInfo,_true> local_138;
  ConflictManager local_130;
  undefined8 local_20;
  DataChunk *local_18;
  optional_ptr local_8 [8];
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool(local_8);
  if (bVar1) {
    pCVar2 = optional_ptr<duckdb::ConflictManager,_true>::operator*(in_stack_fffffffffffffe90);
    (**(code **)(*in_RDI + 0x50))(in_RDI,local_18,local_20,pCVar2);
  }
  else {
    this_00 = (ConflictManager *)DataChunk::size(local_18);
    uVar3 = 0;
    optional_ptr<duckdb::ConflictInfo,_true>::optional_ptr(&local_138,(ConflictInfo *)0x0);
    pCVar2 = &local_130;
    ConflictManager::ConflictManager
              (pCVar2,(VerifyExistenceType)((ulong)this_00 >> 0x38),
               CONCAT44(uVar3,in_stack_fffffffffffffe88),in_stack_fffffffffffffea0);
    (**(code **)(*in_RDI + 0x50))(in_RDI,local_18,local_20,pCVar2);
    ConflictManager::~ConflictManager(this_00);
  }
  return;
}

Assistant:

void ART::VerifyAppend(DataChunk &chunk, IndexAppendInfo &info, optional_ptr<ConflictManager> manager) {
	if (manager) {
		D_ASSERT(manager->LookupType() == VerifyExistenceType::APPEND);
		return VerifyConstraint(chunk, info, *manager);
	}
	ConflictManager local_manager(VerifyExistenceType::APPEND, chunk.size());
	VerifyConstraint(chunk, info, local_manager);
}